

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_parser.cpp
# Opt level: O1

void __thiscall
diligent_spirv_cross::Parser::Parser(Parser *this,uint32_t *spirv_data,size_t word_count)

{
  pointer puVar1;
  allocator_type local_49;
  pointer local_48;
  pointer puStack_40;
  pointer local_38;
  
  ParsedIR::ParsedIR(&this->ir);
  (this->global_struct_cache).super_VectorView<unsigned_int>.ptr = (uint *)0x0;
  (this->global_struct_cache).super_VectorView<unsigned_int>.buffer_size = 0;
  this->current_function = (SPIRFunction *)0x0;
  this->current_block = (SPIRBlock *)0x0;
  this->ignore_trailing_block_opcodes = false;
  (this->global_struct_cache).super_VectorView<unsigned_int>.ptr =
       (uint *)&(this->global_struct_cache).stack_storage;
  (this->global_struct_cache).buffer_capacity = 8;
  (this->forward_pointer_fixups).super_VectorView<std::pair<unsigned_int,_unsigned_int>_>.ptr =
       (pair<unsigned_int,_unsigned_int> *)0x0;
  (this->forward_pointer_fixups).super_VectorView<std::pair<unsigned_int,_unsigned_int>_>.
  buffer_size = 0;
  (this->forward_pointer_fixups).super_VectorView<std::pair<unsigned_int,_unsigned_int>_>.ptr =
       (pair<unsigned_int,_unsigned_int> *)&(this->forward_pointer_fixups).stack_storage;
  (this->forward_pointer_fixups).buffer_capacity = 8;
  ::std::vector<unsigned_int,std::allocator<unsigned_int>>::vector<unsigned_int_const*,void>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_48,spirv_data,
             spirv_data + word_count,&local_49);
  puVar1 = (this->ir).spirv.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->ir).spirv.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = local_48;
  (this->ir).spirv.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = puStack_40;
  (this->ir).spirv.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_38;
  local_48 = (pointer)0x0;
  puStack_40 = (pointer)0x0;
  local_38 = (pointer)0x0;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  if (local_48 != (pointer)0x0) {
    operator_delete(local_48);
  }
  return;
}

Assistant:

Parser::Parser(const uint32_t *spirv_data, size_t word_count)
{
	ir.spirv = vector<uint32_t>(spirv_data, spirv_data + word_count);
}